

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

void penguinV::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  Image *pIVar3;
  Image *pIVar4;
  Image *pIVar5;
  AbsoluteDifferenceForm4 func;
  ImageTypeManager *pIVar6;
  uint8_t uVar7;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in1->_type);
  func = pFVar2->AbsoluteDifference;
  uVar7 = in1->_type;
  if (func == (AbsoluteDifferenceForm4)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      pIVar6 = manager._registrator;
      if (manager._registrator ==
          (ImageTypeManager *)
          manager._input.
          super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        func = (AbsoluteDifferenceForm4)0x0;
      }
      else {
        do {
          pFVar2 = ImageTypeManager::functionTable
                             (this,*(uint8_t *)&(pIVar6->_functionTableMap)._M_t._M_impl);
          func = pFVar2->AbsoluteDifference;
          if (func != (AbsoluteDifferenceForm4)0x0) {
            uVar7 = *(uint8_t *)&(pIVar6->_functionTableMap)._M_t._M_impl;
            break;
          }
          pIVar6 = (ImageTypeManager *)&(pIVar6->_functionTableMap)._M_t._M_impl.field_0x1;
        } while (pIVar6 != (ImageTypeManager *)
                           manager._input.
                           super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      if (manager._registrator != (ImageTypeManager *)0x0) {
        operator_delete(manager._registrator);
      }
    }
    else {
      func = (AbsoluteDifferenceForm4)0x0;
    }
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)func,"AbsoluteDifference");
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = uVar7;
  pIVar3 = anon_unknown.dwarf_3ec06::ImageManager::operator()(&manager,in1);
  pIVar4 = anon_unknown.dwarf_3ec06::ImageManager::operator()(&manager,in2);
  pIVar5 = anon_unknown.dwarf_3ec06::ImageManager::operator()(&manager,out);
  (*func)(pIVar3,startX1,startY1,pIVar4,startX2,startY2,pIVar5,startXOut,startYOut,width,height);
  anon_unknown.dwarf_3ec06::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        initialize( in1, AbsoluteDifference )
        func( manager(in1), startX1, startY1, manager(in2), startX2, startY2, manager(out), startXOut, startYOut, width, height );
    }